

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_dr_flac__decode_flac_frame(ma_dr_flac *pFlac)

{
  ma_int32 *pmVar1;
  ma_uint8 mVar2;
  ma_uint16 mVar3;
  ma_int32 *pmVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  ma_dr_flac *pmVar7;
  byte bVar8;
  ma_bool32 mVar9;
  uint uVar10;
  ma_uint16 *pmVar11;
  ushort uVar12;
  ushort uVar13;
  ulong uVar14;
  ma_dr_flac_subframe *pSubframe;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  byte bVar21;
  int iVar23;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  ma_uint8 lpcPrecision;
  ma_dr_flac_bs *local_f0;
  long local_e8;
  uint local_e0;
  uint local_dc;
  ma_int32 *local_d8;
  ulong local_d0;
  ma_dr_flac *local_c8;
  ma_dr_flac_subframe *local_c0;
  ma_uint16 desiredCRC16;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long lVar25;
  
  (pFlac->currentFLACFrame).subframes[7].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[7].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[7].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[7].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[7].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[6].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[6].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[6].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[6].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[6].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[5].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[5].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[5].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[5].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[5].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[4].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[4].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[4].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[4].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[4].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[3].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[3].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[3].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[3].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[3].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[2].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[2].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[2].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[2].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[2].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[1].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[1].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[1].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[1].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[0].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[0].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[0].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[0].pSamplesS32 = (ma_int32 *)0x0;
  if (pFlac->maxBlockSizeInPCMFrames < (pFlac->currentFLACFrame).header.blockSizeInPCMFrames) {
    return MA_ERROR;
  }
  bVar21 = (&DAT_0017e9e0)[(char)(pFlac->currentFLACFrame).header.channelAssignment];
  if (bVar21 != pFlac->channels) {
    return MA_ERROR;
  }
  local_f0 = &pFlac->bs;
  local_c0 = (pFlac->currentFLACFrame).subframes;
  bVar8 = 1;
  if (1 < bVar21) {
    bVar8 = bVar21;
  }
  local_d0 = (ulong)bVar8;
  local_e8 = 0;
  uVar14 = 0;
  local_c8 = pFlac;
  do {
    pmVar7 = local_c8;
    pmVar4 = local_c8->pDecodedSamples;
    uVar19 = (ulong)(local_c8->currentFLACFrame).header.blockSizeInPCMFrames;
    pSubframe = local_c0 + uVar14;
    mVar9 = ma_dr_flac__read_subframe_header(local_f0,pSubframe);
    if (mVar9 == 0) {
      return MA_ERROR;
    }
    mVar2 = (pmVar7->currentFLACFrame).header.channelAssignment;
    uVar16 = (uint)(pmVar7->currentFLACFrame).header.bitsPerSample;
    if (mVar2 == '\b') {
      if (uVar14 != 1) goto LAB_001672f7;
LAB_0016731c:
      uVar16 = uVar16 + 1;
    }
    else {
      if (uVar14 == 1 && mVar2 == '\n') goto LAB_0016731c;
LAB_001672f7:
      uVar16 = uVar16 + (uVar14 == 0 && mVar2 == '\t');
    }
    if ((0x20 < uVar16) ||
       (uVar17 = uVar16 - pSubframe->wastedBitsPerSample,
       uVar16 < pSubframe->wastedBitsPerSample || uVar17 == 0)) {
      return MA_ERROR;
    }
    pmVar1 = pmVar4 + uVar14 * uVar19;
    pSubframe->pSamplesS32 = pmVar1;
    uVar13 = (pmVar7->currentFLACFrame).header.blockSizeInPCMFrames;
    uVar20 = (ulong)uVar13;
    uVar12 = (ushort)pSubframe->lpcOrder;
    if (uVar13 < uVar12) {
      return MA_ERROR;
    }
    bVar21 = pSubframe->subframeType;
    if (bVar21 < 8) {
      if (bVar21 == 0) {
        mVar9 = ma_dr_flac__read_int32(local_f0,uVar17,(ma_int32 *)&desiredCRC16);
        auVar6 = _DAT_0017ad70;
        if ((uVar20 != 0) && (mVar9 != 0)) {
          lVar18 = uVar20 - 1;
          auVar22._8_4_ = (int)lVar18;
          auVar22._0_8_ = lVar18;
          auVar22._12_4_ = (int)((ulong)lVar18 >> 0x20);
          lVar18 = uVar19 * local_e8;
          auVar22 = auVar22 ^ _DAT_0017ad70;
          uVar19 = 0;
          auVar24 = _DAT_0017ad60;
          auVar26 = _DAT_0017ad90;
          do {
            auVar27 = auVar24 ^ auVar6;
            iVar23 = auVar22._4_4_;
            if ((bool)(~(auVar27._4_4_ == iVar23 && auVar22._0_4_ < auVar27._0_4_ ||
                        iVar23 < auVar27._4_4_) & 1)) {
              *(uint *)((long)pmVar4 + uVar19 + lVar18) = _desiredCRC16;
            }
            if ((auVar27._12_4_ != auVar22._12_4_ || auVar27._8_4_ <= auVar22._8_4_) &&
                auVar27._12_4_ <= auVar22._12_4_) {
              *(uint *)((long)pmVar4 + uVar19 + lVar18 + 4) = _desiredCRC16;
            }
            auVar27 = auVar26 ^ auVar6;
            iVar28 = auVar27._4_4_;
            if (iVar28 <= iVar23 && (iVar28 != iVar23 || auVar27._0_4_ <= auVar22._0_4_)) {
              *(uint *)((long)pmVar4 + uVar19 + lVar18 + 8) = _desiredCRC16;
              *(uint *)((long)pmVar4 + uVar19 + lVar18 + 0xc) = _desiredCRC16;
            }
            lVar25 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 4;
            auVar24._8_8_ = lVar25 + 4;
            lVar25 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 4;
            auVar26._8_8_ = lVar25 + 4;
            uVar19 = uVar19 + 0x10;
          } while (((uint)uVar13 * 4 + 0xc & 0xfffffff0) != uVar19);
        }
      }
      else {
        if (bVar21 != 1) {
          return MA_ERROR;
        }
        if (uVar20 != 0) {
          lVar18 = uVar19 * local_e8;
          uVar19 = 0;
          do {
            mVar9 = ma_dr_flac__read_int32(local_f0,uVar17,(ma_int32 *)&desiredCRC16);
            if (mVar9 == 0) break;
            *(uint *)((long)pmVar4 + uVar19 * 4 + lVar18) = _desiredCRC16;
            uVar19 = uVar19 + 1;
          } while (uVar20 != uVar19);
        }
      }
    }
    else {
      uVar20 = (ulong)uVar12;
      local_d8 = pmVar1;
      if (bVar21 == 8) {
        if (uVar20 != 0) {
          lVar18 = uVar19 * local_e8;
          uVar19 = 0;
          do {
            mVar9 = ma_dr_flac__read_int32(local_f0,uVar17,(ma_int32 *)&desiredCRC16);
            if (mVar9 == 0) goto LAB_00167697;
            *(uint *)((long)pmVar4 + uVar19 * 4 + lVar18) = _desiredCRC16;
            uVar19 = uVar19 + 1;
          } while (uVar20 != uVar19);
        }
        pmVar11 = (ma_uint16 *)
                  (ma_dr_flac__decode_samples__fixed(ma_dr_flac_bs*,unsigned_int,unsigned_int,unsigned_char,int*)
                   ::lpcCoefficientsTable + (ulong)uVar12 * 0x10);
        uVar15 = 0;
        uVar16 = 4;
LAB_0016768d:
        ma_dr_flac__decode_samples_with_residual
                  (local_f0,uVar17,(uint)uVar13,(uint)uVar12,uVar15,uVar16,(ma_int32 *)pmVar11,
                   local_d8);
      }
      else {
        if (bVar21 != 0x20) {
          return MA_ERROR;
        }
        if (uVar12 != 0) {
          lVar18 = uVar19 * local_e8;
          uVar19 = 0;
          do {
            mVar9 = ma_dr_flac__read_int32(local_f0,uVar17,(ma_int32 *)&desiredCRC16);
            if (mVar9 == 0) goto LAB_00167697;
            *(uint *)((long)pmVar4 + uVar19 * 4 + lVar18) = _desiredCRC16;
            uVar19 = uVar19 + 1;
          } while (uVar20 != uVar19);
        }
        mVar9 = ma_dr_flac__read_uint8(local_f0,4,&lpcPrecision);
        if ((mVar9 != 0) && (lpcPrecision != '\x0f')) {
          bVar21 = lpcPrecision + 1;
          lpcPrecision = bVar21;
          mVar9 = ma_dr_flac__read_int32(local_f0,5,(ma_int32 *)&desiredCRC16);
          local_dc = _desiredCRC16;
          if (-1 < (char)desiredCRC16 && mVar9 != 0) {
            local_48 = (undefined1  [16])0x0;
            local_58 = (undefined1  [16])0x0;
            local_68 = (undefined1  [16])0x0;
            local_78 = (undefined1  [16])0x0;
            local_88 = (undefined1  [16])0x0;
            local_98 = (undefined1  [16])0x0;
            local_a8 = (undefined1  [16])0x0;
            _desiredCRC16 = (undefined1  [16])0x0;
            local_e0 = (uint)bVar21;
            if (uVar20 != 0) {
              pmVar11 = &desiredCRC16;
              do {
                mVar9 = ma_dr_flac__read_int32(local_f0,local_e0,(ma_int32 *)pmVar11);
                if (mVar9 == 0) goto LAB_00167697;
                pmVar11 = pmVar11 + 2;
                uVar20 = uVar20 - 1;
              } while (uVar20 != 0);
            }
            uVar15 = local_dc & 0xff;
            pmVar11 = &desiredCRC16;
            uVar16 = local_e0;
            goto LAB_0016768d;
          }
        }
      }
    }
LAB_00167697:
    pmVar7 = local_c8;
    uVar14 = uVar14 + 1;
    local_e8 = local_e8 + 4;
    if (uVar14 == local_d0) {
      uVar16 = -(local_c8->bs).consumedBits & 7;
      if (uVar16 != 0) {
        auVar6[0xf] = 0;
        auVar6._0_15_ = stack0xffffffffffffff49;
        _desiredCRC16 = auVar6 << 8;
        mVar9 = ma_dr_flac__read_uint8(local_f0,uVar16,(ma_uint8 *)&desiredCRC16);
        if (mVar9 == 0) {
          return MA_AT_END;
        }
      }
      uVar16 = (pmVar7->bs).consumedBits;
      uVar13 = (pmVar7->bs).crc16;
      uVar19 = (ulong)uVar13;
      uVar17 = (uint)uVar13;
      uVar14 = (pmVar7->bs).crc16Cache;
      if (uVar16 == 0x40) {
        uVar10 = (uint)uVar14;
        uVar12 = (ushort)(uVar14 >> 0x30);
        uVar15 = (uint)(uVar14 >> 0x10);
        uVar16 = (uint)(uVar14 >> 0x18);
        uVar5 = (uint)(uVar14 >> 0x20);
        switch((pmVar7->bs).crc16CacheIgnoredBytes) {
        case 0:
          (pmVar7->bs).crc16 =
               ma_dr_flac__crc16_table
               [((uint)ma_dr_flac__crc16_table
                       [((uint)ma_dr_flac__crc16_table
                               [(uVar5 >> 8 ^
                                ((uint)ma_dr_flac__crc16_table
                                       [(uint)(uVar13 >> 8) ^ (uint)(byte)(uVar14 >> 0x38)] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)uVar12 ^
                                       ((uint)uVar13 << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uint)(uVar13 >> 8) ^ (uint)(byte)(uVar14 >> 0x38)])
                                       >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                        (uint)ma_dr_flac__crc16_table
                              [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                               [((uint)uVar12 ^
                                                ((uint)uVar13 << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar13 >> 8) ^
                                                       (uint)(byte)(uVar14 >> 0x38)]) >> 8 & 0xff) &
                                                0xff] << 8 ^
                                        (uint)ma_dr_flac__crc16_table
                                              [(uVar5 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar13 >> 8) ^
                                                       (uint)(byte)(uVar14 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar12 ^
                                                      ((uint)uVar13 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar13 >> 8) ^
                                                             (uint)(byte)(uVar14 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 &
                                        0xff) & 0xff]) >> 8 & 0xff ^ uVar16 & 0xff] << 8 ^ uVar10 ^
                (uint)ma_dr_flac__crc16_table
                      [(((uint)ma_dr_flac__crc16_table
                               [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                [((uint)uVar12 ^
                                                 ((uint)uVar13 << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [(uint)(uVar13 >> 8) ^
                                                        (uint)(byte)(uVar14 >> 0x38)]) >> 8 & 0xff)
                                                 & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(uVar5 >> 8 ^
                                                ((uint)ma_dr_flac__crc16_table
                                                       [(uint)(uVar13 >> 8) ^
                                                        (uint)(byte)(uVar14 >> 0x38)] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [((uint)uVar12 ^
                                                       ((uint)uVar13 << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar13 >> 8) ^
                                                              (uint)(byte)(uVar14 >> 0x38)]) >> 8 &
                                                       0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 &
                                         0xff) & 0xff] << 8 ^
                        (uint)ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [(uVar5 >> 8 ^
                                       ((uint)ma_dr_flac__crc16_table
                                              [(uint)(uVar13 >> 8) ^ (uint)(byte)(uVar14 >> 0x38)]
                                        << 8 ^ (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar12 ^
                                                      ((uint)uVar13 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar13 >> 8) ^
                                                             (uint)(byte)(uVar14 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                      [((uint)uVar12 ^
                                                       ((uint)uVar13 << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar13 >> 8) ^
                                                              (uint)(byte)(uVar14 >> 0x38)]) >> 8 &
                                                       0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar5 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar13 >> 8) ^
                                                              (uint)(byte)(uVar14 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar12 ^
                                                             ((uint)uVar13 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar13 >> 8) ^
                                                                    (uint)(byte)(uVar14 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                      0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                               uVar16 & 0xff]) >> 8 & 0xff ^ uVar15 & 0xffff) & 0xff]) >> 8 & 0xff]
               << 8 ^ ma_dr_flac__crc16_table
                      [(((uint)ma_dr_flac__crc16_table
                               [(((uint)ma_dr_flac__crc16_table
                                        [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                         [((uint)uVar12 ^
                                                          ((uint)uVar13 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar13 >> 8) ^
                                                                 (uint)(byte)(uVar14 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar5 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar13 >> 8) ^
                                                                 (uint)(byte)(uVar14 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar12 ^
                                                                  ((uint)uVar13 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar13 >> 8) ^
                                                                         (uint)(byte)(uVar14 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                 (uint)ma_dr_flac__crc16_table
                                       [((uint)ma_dr_flac__crc16_table
                                               [(uVar5 >> 8 ^
                                                ((uint)ma_dr_flac__crc16_table
                                                       [(uint)(uVar13 >> 8) ^
                                                        (uint)(byte)(uVar14 >> 0x38)] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [((uint)uVar12 ^
                                                       ((uint)uVar13 << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar13 >> 8) ^
                                                              (uint)(byte)(uVar14 >> 0x38)]) >> 8 &
                                                       0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                        (uint)ma_dr_flac__crc16_table
                                              [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar12 ^
                                                                ((uint)uVar13 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar13 >> 8) ^
                                                                       (uint)(byte)(uVar14 >> 0x38)]
                                                                ) >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar5 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar13 >> 8) ^
                                                                       (uint)(byte)(uVar14 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar12 ^
                                                                              ((uint)uVar13 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar13 >> 8) ^
                                                   (uint)(byte)(uVar14 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff])
                                        >> 8 & 0xff ^ uVar16 & 0xff]) >> 8 & 0xff ^ uVar15 & 0xffff)
                                & 0xff] << 8 ^
                        (uint)ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar5 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar13 >> 8) ^
                                                       (uint)(byte)(uVar14 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar12 ^
                                                      ((uint)uVar13 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar13 >> 8) ^
                                                             (uint)(byte)(uVar14 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar12 ^
                                                               ((uint)uVar13 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar13 >> 8) ^
                                                                      (uint)(byte)(uVar14 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar5 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar13 >> 8) ^
                                                                      (uint)(byte)(uVar14 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar12 ^
                                                                             ((uint)uVar13 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar13 >> 8) ^
                                                   (uint)(byte)(uVar14 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff])
                                       >> 8 & 0xff ^ uVar16 & 0xff] << 8 ^ uVar10 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar12 ^
                                                                ((uint)uVar13 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar13 >> 8) ^
                                                                       (uint)(byte)(uVar14 >> 0x38)]
                                                                ) >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar5 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar13 >> 8) ^
                                                                       (uint)(byte)(uVar14 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar12 ^
                                                                              ((uint)uVar13 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar13 >> 8) ^
                                                   (uint)(byte)(uVar14 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                        << 8 ^ (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar5 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar13 >> 8) ^
                                                                      (uint)(byte)(uVar14 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar12 ^
                                                                             ((uint)uVar13 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar13 >> 8) ^
                                                   (uint)(byte)(uVar14 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar12 ^
                                                                          ((uint)uVar13 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar13 >> 8) ^
                                                   (uint)(byte)(uVar14 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar5 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar13 >> 8) ^
                                                                 (uint)(byte)(uVar14 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar12 ^
                                                                  ((uint)uVar13 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar13 >> 8) ^
                                                                         (uint)(byte)(uVar14 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar16 & 0xff]
                                       ) >> 8 & 0xff ^ uVar15 & 0xffff) & 0xff]) >> 8 & 0xff]) >> 8
                        & 0xff ^ uVar10) & 0xff];
          break;
        case 1:
          uVar17 = (uint)(ushort)(uVar13 << 8 ^
                                 ma_dr_flac__crc16_table[(ushort)(uVar12 ^ uVar13 >> 8) & 0xff]);
        case 2:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table[(uVar5 ^ uVar17) >> 8 & 0xff]);
        case 3:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table[(uVar5 ^ uVar17 >> 8) & 0xff]);
        case 4:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table[uVar17 >> 8 ^ uVar16 & 0xff]);
        case 5:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table[(uVar17 >> 8 ^ uVar15 & 0xffff) & 0xff]);
        case 6:
          uVar19 = (ulong)(ushort)((ushort)(uVar17 << 8) ^
                                  ma_dr_flac__crc16_table[(uVar10 ^ uVar17) >> 8 & 0xff]);
        case 7:
          uVar13 = (ushort)((int)uVar19 << 8) ^
                   ma_dr_flac__crc16_table[(uVar10 ^ (uint)(uVar19 >> 8)) & 0xff];
        default:
          (pmVar7->bs).crc16 = uVar13;
          (pmVar7->bs).crc16CacheIgnoredBytes = 0;
        }
      }
      else {
        uVar14 = uVar14 >> (-(char)uVar16 & 0x3fU);
        uVar15 = (uint)(uVar14 >> 0x20);
        switch(~(pmVar7->bs).crc16CacheIgnoredBytes + (uVar16 >> 3)) {
        case 7:
          uVar17 = (uint)(ushort)(uVar13 << 8 ^
                                 ma_dr_flac__crc16_table
                                 [(uint)(uVar13 >> 8) ^ (uint)(byte)(uVar14 >> 0x38)]);
        case 6:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table
                                 [((uint)(ushort)(uVar14 >> 0x30) ^ uVar17 >> 8) & 0xff]);
        case 5:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table[(uVar15 ^ uVar17) >> 8 & 0xff]);
        case 4:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table[(uVar15 ^ uVar17 >> 8) & 0xff]);
        case 3:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table
                                 [uVar17 >> 8 ^ (uint)(uVar14 >> 0x18) & 0xff]);
        case 2:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table
                                 [(uVar17 >> 8 ^ (uint)(uVar14 >> 0x10) & 0xffff) & 0xff]);
        case 1:
          uVar19 = (ulong)(ushort)((ushort)(uVar17 << 8) ^
                                  ma_dr_flac__crc16_table[((uint)uVar14 ^ uVar17) >> 8 & 0xff]);
        case 0:
          uVar13 = (ushort)((int)uVar19 << 8) ^
                   ma_dr_flac__crc16_table[((uint)uVar14 ^ (uint)(uVar19 >> 8)) & 0xff];
        default:
          (pmVar7->bs).crc16 = uVar13;
          (pmVar7->bs).crc16CacheIgnoredBytes = uVar16 >> 3;
        }
      }
      mVar3 = (pmVar7->bs).crc16;
      mVar9 = ma_dr_flac__read_uint16(local_f0,0x10,&desiredCRC16);
      if (mVar9 == 0) {
        return MA_AT_END;
      }
      if (mVar3 == desiredCRC16) {
        (pmVar7->currentFLACFrame).pcmFramesRemaining =
             (uint)(pmVar7->currentFLACFrame).header.blockSizeInPCMFrames;
        return MA_SUCCESS;
      }
      return MA_CRC_MISMATCH;
    }
  } while( true );
}

Assistant:

static ma_result ma_dr_flac__decode_flac_frame(ma_dr_flac* pFlac)
{
    int channelCount;
    int i;
    ma_uint8 paddingSizeInBits;
    ma_uint16 desiredCRC16;
#ifndef MA_DR_FLAC_NO_CRC
    ma_uint16 actualCRC16;
#endif
    MA_DR_FLAC_ZERO_MEMORY(pFlac->currentFLACFrame.subframes, sizeof(pFlac->currentFLACFrame.subframes));
    if (pFlac->currentFLACFrame.header.blockSizeInPCMFrames > pFlac->maxBlockSizeInPCMFrames) {
        return MA_ERROR;
    }
    channelCount = ma_dr_flac__get_channel_count_from_channel_assignment(pFlac->currentFLACFrame.header.channelAssignment);
    if (channelCount != (int)pFlac->channels) {
        return MA_ERROR;
    }
    for (i = 0; i < channelCount; ++i) {
        if (!ma_dr_flac__decode_subframe(&pFlac->bs, &pFlac->currentFLACFrame, i, pFlac->pDecodedSamples + (pFlac->currentFLACFrame.header.blockSizeInPCMFrames * i))) {
            return MA_ERROR;
        }
    }
    paddingSizeInBits = (ma_uint8)(MA_DR_FLAC_CACHE_L1_BITS_REMAINING(&pFlac->bs) & 7);
    if (paddingSizeInBits > 0) {
        ma_uint8 padding = 0;
        if (!ma_dr_flac__read_uint8(&pFlac->bs, paddingSizeInBits, &padding)) {
            return MA_AT_END;
        }
    }
#ifndef MA_DR_FLAC_NO_CRC
    actualCRC16 = ma_dr_flac__flush_crc16(&pFlac->bs);
#endif
    if (!ma_dr_flac__read_uint16(&pFlac->bs, 16, &desiredCRC16)) {
        return MA_AT_END;
    }
#ifndef MA_DR_FLAC_NO_CRC
    if (actualCRC16 != desiredCRC16) {
        return MA_CRC_MISMATCH;
    }
#endif
    pFlac->currentFLACFrame.pcmFramesRemaining = pFlac->currentFLACFrame.header.blockSizeInPCMFrames;
    return MA_SUCCESS;
}